

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unsimplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  byte *pbVar1;
  char cVar2;
  SPxSense SVar3;
  SPxOut *pSVar4;
  undefined8 uVar5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar6;
  undefined8 uVar7;
  long *plVar8;
  pointer pnVar9;
  pointer pnVar10;
  int iVar11;
  pointer pnVar12;
  long lVar13;
  uint *puVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  uint *puVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  Verbosity old_verbosity;
  undefined1 auStack_4c4 [12];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [13];
  undefined3 uStack_45b;
  uint uStack_458;
  bool bStack_454;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_448;
  undefined8 uStack_440;
  undefined4 local_42c;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_428;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_420;
  VarStatus *local_418;
  cpp_dec_float<200U,_int,_void> local_3f0;
  cpp_dec_float<200U,_int,_void> local_370;
  cpp_dec_float<200U,_int,_void> local_2f0;
  cpp_dec_float<200U,_int,_void> local_270;
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar23 = 0;
  pSVar4 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  local_428 = r;
  local_420 = s;
  local_418 = rows;
  if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
    old_verbosity = pSVar4->m_verbosity;
    local_42c = 3;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," --- unsimplifying solution and basis",0x25);
    cVar2 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity);
  }
  pnVar12 = (x->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(x->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
    lVar20 = 0x1e;
    lVar18 = 0;
    do {
      puVar14 = (pnVar12->m_backend).data._M_elems + lVar20;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      puVar17 = local_a0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
      }
      iVar11 = puVar14[0xfffffffffffffffe];
      cVar2 = *(char *)(puVar14 + 0xffffffffffffffff);
      uVar5._0_4_ = puVar14[0];
      uVar5._4_4_ = puVar14[1];
      uStack_440 = 0;
      local_448 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar5;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_270,this);
      puVar14 = local_a0;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar16->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
      }
      bStack_454 = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         (old_verbosity != ERROR || (fpclass_type)local_448 != cpp_dec_float_finite)) {
        bStack_454 = false;
      }
      if ((((fpclass_type)local_448 == cpp_dec_float_NaN) ||
          (local_270.fpclass == cpp_dec_float_NaN)) ||
         (uStack_458 = iVar11,
         local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)uVar5,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_270),
         0 < iVar11)) {
        puVar14 = (((x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
        puVar15 = puVar14 + 0xffffffffffffffe2;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        }
        uStack_458 = puVar14[0xfffffffffffffffe];
        bStack_454 = (bool)*(undefined1 *)(puVar14 + 0xffffffffffffffff);
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*(undefined8 *)puVar14;
      }
      else {
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = SUB1613((undefined1  [16])0x0,0);
        uStack_45b = 0;
        uStack_458 = 0;
        bStack_454 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar14 = (((this->m_prim).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar15 = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
      }
      puVar14[0xfffffffffffffffe] = uStack_458;
      *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_454;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar14 = local_450;
      puVar14 = (((local_428->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar20 + -0x1e;
      puVar15 = puVar14;
      puVar17 = local_110;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
      }
      uVar21 = puVar14[0x1c];
      cVar2 = (char)puVar14[0x1d];
      pVVar6 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(puVar14 + 0x1e);
      uStack_440 = 0;
      local_448 = pVVar6;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_2f0,this);
      puVar14 = local_110;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar16->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
      }
      bStack_454 = (bool)cVar2;
      if ((cVar2 == '\x01') && (old_verbosity != ERROR || (fpclass_type)local_448 != 0)) {
        bStack_454 = false;
      }
      if ((((fpclass_type)local_448 == 2) || (local_2f0.fpclass == cpp_dec_float_NaN)) ||
         (uStack_458 = uVar21, local_450 = pVVar6,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_2f0),
         0 < iVar11)) {
        SVar3 = this->m_thesense;
        puVar14 = (((local_428->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar20 + -0x1e;
        puVar15 = puVar14;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        }
        uStack_458 = puVar14[0x1c];
        bStack_454 = (bool)(byte)puVar14[0x1d];
        local_450._0_4_ = puVar14[0x1e];
        local_450._4_4_ = puVar14[0x1f];
        if ((SVar3 == MAXIMIZE) &&
           ((fpclass_type)local_450 != cpp_dec_float_finite || old_verbosity != ERROR)) {
          bStack_454 = (bool)((byte)puVar14[0x1d] ^ 1);
        }
      }
      else {
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = SUB1613((undefined1  [16])0x0,0);
        uStack_45b = 0;
        uStack_458 = 0;
        bStack_454 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar14 = (((this->m_redCost).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar15 = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
      }
      puVar14[0xfffffffffffffffe] = uStack_458;
      *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_454;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar14 = local_450;
      (this->m_cBasisStat).data[lVar18] = cols[lVar18];
      lVar18 = lVar18 + 1;
      pnVar12 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x20;
    } while (lVar18 < (int)((ulong)((long)(x->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12
                                   ) >> 7));
  }
  pnVar12 = (y->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(y->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
    lVar20 = 0x1e;
    lVar18 = 0;
    do {
      puVar14 = (pnVar12->m_backend).data._M_elems + lVar20;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      puVar17 = local_180;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
      }
      iVar11 = puVar14[0xfffffffffffffffe];
      cVar2 = *(char *)(puVar14 + 0xffffffffffffffff);
      uVar7._0_4_ = puVar14[0];
      uVar7._4_4_ = puVar14[1];
      uStack_440 = 0;
      local_448 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar7;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_370,this);
      puVar14 = local_180;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar16->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
      }
      bStack_454 = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         (old_verbosity != ERROR || (fpclass_type)local_448 != cpp_dec_float_finite)) {
        bStack_454 = false;
      }
      if ((((fpclass_type)local_448 == cpp_dec_float_NaN) ||
          (local_370.fpclass == cpp_dec_float_NaN)) ||
         (uStack_458 = iVar11,
         local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)uVar7,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_370),
         0 < iVar11)) {
        SVar3 = this->m_thesense;
        puVar14 = (((y->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar20 + -0x1e;
        puVar15 = puVar14;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        }
        uStack_458 = puVar14[0x1c];
        bStack_454 = (bool)(byte)puVar14[0x1d];
        local_450._0_4_ = puVar14[0x1e];
        local_450._4_4_ = puVar14[0x1f];
        if ((SVar3 == MAXIMIZE) &&
           ((fpclass_type)local_450 != cpp_dec_float_finite || old_verbosity != ERROR)) {
          bStack_454 = (bool)((byte)puVar14[0x1d] ^ 1);
        }
      }
      else {
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = SUB1613((undefined1  [16])0x0,0);
        uStack_45b = 0;
        uStack_458 = 0;
        bStack_454 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar14 = (((this->m_dual).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar15 = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
      }
      puVar14[0xfffffffffffffffe] = uStack_458;
      *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_454;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar14 = local_450;
      puVar14 = (((local_420->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar20 + -0x1e;
      puVar15 = puVar14;
      puVar17 = local_1f0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
      }
      uVar21 = puVar14[0x1c];
      cVar2 = (char)puVar14[0x1d];
      pVVar6 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(puVar14 + 0x1e);
      uStack_440 = 0;
      local_448 = pVVar6;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_3f0,this);
      puVar14 = local_1f0;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar16->data)._M_elems[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
      }
      bStack_454 = (bool)cVar2;
      if ((cVar2 == '\x01') && (old_verbosity != ERROR || (fpclass_type)local_448 != 0)) {
        bStack_454 = false;
      }
      if ((((fpclass_type)local_448 == 2) || (local_3f0.fpclass == cpp_dec_float_NaN)) ||
         (uStack_458 = uVar21, local_450 = pVVar6,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_3f0),
         0 < iVar11)) {
        puVar14 = (((local_420->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
        puVar15 = puVar14 + 0xffffffffffffffe2;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        }
        uStack_458 = puVar14[0xfffffffffffffffe];
        bStack_454 = (bool)*(byte *)(puVar14 + 0xffffffffffffffff);
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*(undefined8 *)puVar14;
      }
      else {
        local_450 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = SUB1613((undefined1  [16])0x0,0);
        uStack_45b = 0;
        uStack_458 = 0;
        bStack_454 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar14 = (((this->m_slack).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar20;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      puVar15 = puVar14 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar15 = (pcVar16->data)._M_elems[0];
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar23 * -8 + 4);
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
      }
      puVar14[0xfffffffffffffffe] = uStack_458;
      *(bool *)(puVar14 + 0xffffffffffffffff) = bStack_454;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar14 = local_450;
      (this->m_rBasisStat).data[lVar18] = local_418[lVar18];
      lVar18 = lVar18 + 1;
      pnVar12 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x20;
    } while (lVar18 < (int)((ulong)((long)(y->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12
                                   ) >> 7));
  }
  this_00 = &this->m_hist;
  uVar21 = (uint)((ulong)((long)(this->m_hist).data.
                                super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_hist).data.
                               super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar21) {
    local_448 = &this->m_dual;
    uVar22 = (ulong)(uVar21 & 0x7fffffff);
    uVar19 = uVar22 + 1;
    lVar18 = uVar22 << 4;
    do {
      (**(code **)(**(long **)((long)&(this_00->data).
                                      super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].
                                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar18) + 0x10))();
      plVar8 = *(long **)((long)&(this_00->data).
                                 super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar18);
      (**(code **)(*plVar8 + 0x20))
                (plVar8,&this->m_prim,local_448,&this->m_slack,&this->m_redCost,&this->m_cBasisStat,
                 &this->m_rBasisStat,isOptimal);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::resize(&this_00->data,uVar19 - 2);
      uVar19 = uVar19 - 1;
      lVar18 = lVar18 + -0x10;
    } while (1 < uVar19);
  }
  if (this->m_thesense == MAXIMIZE) {
    pnVar12 = (this->m_redCost).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
      pnVar9 = (this->m_redCost).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = (this->m_redCost).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = 0x78;
      lVar20 = 0;
      do {
        pbVar1 = (byte *)((long)(pnVar12->m_backend).data._M_elems + lVar18 + -4);
        *pbVar1 = *pbVar1 ^ (*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar18 + -0x78) !=
                             0 || *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar18) != 0);
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x80;
        pnVar12 = pnVar9;
      } while (lVar20 < (int)((ulong)((long)pnVar10 - (long)pnVar9) >> 7));
    }
    pnVar12 = (this->m_dual).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_dual).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
      pnVar9 = (this->m_dual).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = (this->m_dual).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = 0x78;
      lVar20 = 0;
      do {
        pbVar1 = (byte *)((long)(pnVar12->m_backend).data._M_elems + lVar18 + -4);
        *pbVar1 = *pbVar1 ^ (*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar18 + -0x78) !=
                             0 || *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar18) != 0);
        lVar20 = lVar20 + 1;
        lVar18 = lVar18 + 0x80;
        pnVar12 = pnVar9;
      } while (lVar20 < (int)((ulong)((long)pnVar10 - (long)pnVar9) >> 7));
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_prim,
            (int)((ulong)((long)(this->m_prim).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_prim).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_redCost,
            (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_redCost).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}